

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.h
# Opt level: O0

void __thiscall ON_ClippingPlaneInfo::ON_ClippingPlaneInfo(ON_ClippingPlaneInfo *this)

{
  char *local_18;
  ON_ClippingPlaneInfo *this_local;
  
  ON_PlaneEquation::ON_PlaneEquation(&this->m_plane_equation);
  (this->m_plane_id).Data1 = 0;
  (this->m_plane_id).Data2 = 0;
  (this->m_plane_id).Data3 = 0;
  (this->m_plane_id).Data4[0] = '\0';
  (this->m_plane_id).Data4[1] = '\0';
  (this->m_plane_id).Data4[2] = '\0';
  (this->m_plane_id).Data4[3] = '\0';
  (this->m_plane_id).Data4[4] = '\0';
  (this->m_plane_id).Data4[5] = '\0';
  (this->m_plane_id).Data4[6] = '\0';
  (this->m_plane_id).Data4[7] = '\0';
  this->m_bEnabled = false;
  this->m_depth_enabled = false;
  local_18 = this->m_reserved;
  do {
    *local_18 = '\0';
    local_18 = local_18 + 1;
  } while ((float *)local_18 != &this->m_depth);
  this->m_depth = 0.0;
  return;
}

Assistant:

class ON_CLASS ON_ClippingPlaneInfo
{
public:
  // C++ defaults for construction, destruction, copy construction
  // and operator= work fine.

  // A point is visible if m_plane_equation.ValueAt(point) <= 0.
  // (This is the opposite convention from what OpenGL uses.)
  ON_PlaneEquation m_plane_equation;
  ON_UUID m_plane_id = ON_nil_uuid;
  bool m_bEnabled = false;

  // A distance where the clipping plane does not clip geometry.
  // A positive value is equivalent to placing another clipping plane at a
  // distance from this clipping plane along it's normal and then flipping it
  //
  // The depth must also be enabled to be effective
  double Depth() const;

  // Negative depth values are currently not allowed. If a negative depth value
  // is passed to this function, it will not the the internal depth value
  void SetDepth(double depth);

  // Default is false
  bool DepthEnabled() const;
  void SetDepthEnabled(bool on);

  void Default();
  bool Write( ON_BinaryArchive& ) const;
  bool Read( ON_BinaryArchive& );

private:
  bool m_depth_enabled = false;
  char m_reserved[2] = {};

  // This should be a double, but is a float in order to not change
  // the class size. When the Rhino SDK can break, this data type should change.
  float m_depth = 0;
}